

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

bool __thiscall QMakeEvaluator::loadSpecInternal(QMakeEvaluator *this)

{
  QString *str;
  QArrayData *pQVar1;
  char16_t *pcVar2;
  char *pcVar3;
  Data *pDVar4;
  Data *pDVar5;
  ProString *pPVar6;
  qsizetype qVar7;
  VisitReturn VVar8;
  ProStringList *pPVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QAnyStringView QVar14;
  QStringView QVar15;
  ProKey local_f8;
  ProString local_c8;
  QArrayDataPointer<ProString> local_98;
  QString local_78;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar11.m_data = &DAT_0000000c;
  QVar11.m_size = (qsizetype)&local_c8;
  QString::fromLatin1(QVar11);
  pDVar4 = local_c8.m_string.d.d;
  local_f8.super_ProString.m_string.d.d = local_c8.m_string.d.d;
  local_f8.super_ProString.m_string.d.ptr = local_c8.m_string.d.ptr;
  local_f8.super_ProString.m_string.d.size = local_c8.m_string.d.size;
  VVar8 = evaluateFeatureFile(this,(QString *)&local_f8,false);
  if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (VVar8 == ReturnTrue) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    str = &this->m_qmakespec;
    local_c8.m_string.d.ptr = (char16_t *)0xb;
    local_c8.m_string.d.size = 0x2a9586;
    local_c8.m_string.d.d = (Data *)str;
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
              (&local_78,(QStringBuilder<QString_&,_QLatin1String> *)&local_c8);
    VVar8 = evaluateFile(this,&local_78,EvalConfigFile,(LoadFlags)0x0);
    if (VVar8 == ReturnTrue) {
      ProString::ProString(&local_c8,str);
      local_98.d = (Data *)0x0;
      local_98.ptr = (ProString *)0x0;
      local_98.size = 0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_98,0,&local_c8);
      QList<ProString>::end((QList<ProString> *)&local_98);
      ProKey::ProKey(&local_f8,"QMAKESPEC");
      pPVar9 = valuesRef(this,&local_f8);
      qVar7 = local_98.size;
      pPVar6 = local_98.ptr;
      pDVar5 = local_98.d;
      local_98.d = (Data *)0x0;
      local_98.ptr = (ProString *)0x0;
      local_98.size = 0;
      local_58.d = (pPVar9->super_QList<ProString>).d.d;
      local_58.ptr = (pPVar9->super_QList<ProString>).d.ptr;
      (pPVar9->super_QList<ProString>).d.d = pDVar5;
      (pPVar9->super_QList<ProString>).d.ptr = pPVar6;
      local_58.size = (pPVar9->super_QList<ProString>).d.size;
      (pPVar9->super_QList<ProString>).d.size = qVar7;
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
      if (&(local_f8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_98);
      if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVar15 = QMakeInternal::IoUtils::fileName(str);
      QString::QString(&local_c8.m_string,(QChar *)QVar15.m_data,QVar15.m_size);
      pQVar1 = &((this->m_qmakespecName).d.d)->super_QArrayData;
      pcVar2 = (this->m_qmakespecName).d.ptr;
      (this->m_qmakespecName).d.d = local_c8.m_string.d.d;
      (this->m_qmakespecName).d.ptr = local_c8.m_string.d.ptr;
      pcVar3 = (char *)(this->m_qmakespecName).d.size;
      (this->m_qmakespecName).d.size = local_c8.m_string.d.size;
      local_c8.m_string.d.d = (Data *)pQVar1;
      local_c8.m_string.d.ptr = pcVar2;
      local_c8.m_string.d.size = (qsizetype)pcVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      QVar12.m_data = (storage_type *)0xd;
      QVar12.m_size = (qsizetype)&local_c8;
      QString::fromLatin1(QVar12);
      pDVar4 = local_c8.m_string.d.d;
      local_f8.super_ProString.m_string.d.d = local_c8.m_string.d.d;
      local_f8.super_ProString.m_string.d.ptr = local_c8.m_string.d.ptr;
      local_f8.super_ProString.m_string.d.size = local_c8.m_string.d.size;
      VVar8 = evaluateFeatureFile(this,(QString *)&local_f8,false);
      bVar10 = VVar8 == ReturnTrue;
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QVar13.m_data = (storage_type *)0x2b;
      QVar13.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar13);
      QVar14.m_size = (size_t)&local_f8;
      QVar14.field_0.m_data = &local_c8;
      QString::arg_impl(QVar14,(int)local_78.d.ptr,(QChar)(char16_t)local_78.d.size);
      message(this,0x310,&local_c8.m_string);
      if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar10 = false;
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    bVar10 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeEvaluator::loadSpecInternal()
{
    if (evaluateFeatureFile(QLatin1String("spec_pre.prf")) != ReturnTrue)
        return false;
    QString spec = m_qmakespec + QLatin1String("/qmake.conf");
    if (evaluateFile(spec, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue) {
        evalError(fL1S("Could not read qmake configuration file %1.").arg(spec));
        return false;
    }
#ifndef QT_BUILD_QMAKE
    // Legacy support for Qt4 default specs
#  ifdef Q_OS_UNIX
    if (m_qmakespec.endsWith(QLatin1String("/default-host"))
        || m_qmakespec.endsWith(QLatin1String("/default"))) {
        QString rspec = QFileInfo(m_qmakespec).symLinkTarget();
        if (!rspec.isEmpty())
            m_qmakespec = QDir::cleanPath(QDir(m_qmakespec).absoluteFilePath(rspec));
    }
#  else
    // We can't resolve symlinks as they do on Unix, so configure.exe puts
    // the source of the qmake.conf at the end of the default/qmake.conf in
    // the QMAKESPEC_ORIGINAL variable.
    const ProString &orig_spec = first(ProKey("QMAKESPEC_ORIGINAL"));
    if (!orig_spec.isEmpty()) {
        QString spec = orig_spec.toQString();
        if (IoUtils::isAbsolutePath(spec))
            m_qmakespec = spec;
    }
#  endif
#endif
    valuesRef(ProKey("QMAKESPEC")) = ProString(m_qmakespec);
    m_qmakespecName = IoUtils::fileName(m_qmakespec).toString();
    // This also ensures that m_featureRoots is valid.
    if (evaluateFeatureFile(QLatin1String("spec_post.prf")) != ReturnTrue)
        return false;
    return true;
}